

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O2

double msen(jas_matrix_t *x,jas_matrix_t *y,int n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  lVar1 = x->numrows_;
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  dVar6 = 0.0;
  lVar3 = 0;
  do {
    if (lVar3 == lVar2) {
      return dVar6 / ((double)x->numcols_ * (double)lVar1);
    }
    lVar4 = x->numcols_;
    if (x->numcols_ < 1) {
      lVar4 = 0;
    }
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      dVar7 = (double)(y->rows_[lVar3][lVar5] - x->rows_[lVar3][lVar5]);
      if (n == 2) {
        dVar7 = dVar7 * dVar7;
      }
      else {
        if (n != 1) {
          abort();
        }
        dVar7 = ABS(dVar7);
      }
      dVar6 = dVar6 + dVar7;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

double msen(jas_matrix_t *x, jas_matrix_t *y, int n)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j);
			if (n == 1) {
				s += fabs(d);
			} else if (n == 2) {
				s += d * d;
			} else {
				abort();
			}
		}
	}

	return s / ((double) jas_matrix_numrows(x) * jas_matrix_numcols(x));
}